

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_splt(spng_ctx *ctx,spng_splt *splt,uint32_t n_splt)

{
  int iVar1;
  uint local_2c;
  uint32_t i;
  int ret;
  uint32_t n_splt_local;
  spng_splt *splt_local;
  spng_ctx *ctx_local;
  
  if (n_splt == 0) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx == (spng_ctx *)0x0) || (splt == (spng_splt *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      for (local_2c = 0; local_2c < n_splt; local_2c = local_2c + 1) {
        iVar1 = check_png_keyword(splt[local_2c].name);
        if (iVar1 != 0) {
          return 0x38;
        }
        if ((splt[local_2c].sample_depth != '\b') && (splt[local_2c].sample_depth != '\x10')) {
          return 0x3a;
        }
      }
      if ((((uint)ctx->stored >> 0xc & 1) != 0) && (((uint)ctx->user >> 0xc & 1) == 0)) {
        for (local_2c = 0; local_2c < ctx->n_splt; local_2c = local_2c + 1) {
          if (ctx->splt_list[local_2c].entries != (spng_splt_entry *)0x0) {
            spng__free(ctx,ctx->splt_list[local_2c].entries);
          }
        }
        spng__free(ctx,ctx->splt_list);
      }
      ctx->splt_list = splt;
      ctx->n_splt = n_splt;
      ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xffffefff | 0x1000);
      ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xffffefff | 0x1000);
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_splt(spng_ctx *ctx, struct spng_splt *splt, uint32_t n_splt)
{
    if(!n_splt) return 1;
    SPNG_SET_CHUNK_BOILERPLATE(splt);

    uint32_t i;
    for(i=0; i < n_splt; i++)
    {
        if(check_png_keyword(splt[i].name)) return SPNG_ESPLT_NAME;
        if( !(splt[i].sample_depth == 8 || splt[i].sample_depth == 16) ) return SPNG_ESPLT_DEPTH;
    }

    if(ctx->stored.splt && !ctx->user.splt)
    {
        for(i=0; i < ctx->n_splt; i++)
        {
            if(ctx->splt_list[i].entries != NULL) spng__free(ctx, ctx->splt_list[i].entries);
        }
        spng__free(ctx, ctx->splt_list);
    }

    ctx->splt_list = splt;
    ctx->n_splt = n_splt;

    ctx->stored.splt = 1;
    ctx->user.splt = 1;

    return 0;
}